

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector3 * vector3_subtractf(vector3 *self,double f)

{
  double f_local;
  vector3 *self_local;
  
  (self->field_0).v[0] = (self->field_0).v[0] - f;
  (self->field_0).v[1] = (self->field_0).v[1] - f;
  (self->field_0).v[2] = (self->field_0).v[2] - f;
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_subtractf(struct vector3 *self, HYP_FLOAT f)
{
	self->v[0] -= f;
	self->v[1] -= f;
	self->v[2] -= f;
	return self;
}